

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O0

void __thiscall V2Osc::set(V2Osc *this,syVOsc *para)

{
  uint32_t uVar1;
  float fVar2;
  float col;
  syVOsc *para_local;
  V2Osc *this_local;
  
  this->mode = (int)para->mode;
  this->ring = ((int)para->ring & 1U) != 0;
  this->pitch = (para->pitch - 64.0) + (para->detune - 64.0) / 128.0;
  chgPitch(this);
  this->gain = para->gain / 128.0;
  fVar2 = para->color / 128.0;
  uVar1 = ftou32(fVar2);
  this->brpt = uVar1;
  fVar2 = sqrtf(fVar2);
  this->nfres = 1.0 - fVar2;
  return;
}

Assistant:

void set(const syVOsc *para)
    {
        mode = (int)para->mode;
        ring = (((int)para->ring) & 1) != 0;

        pitch = (para->pitch - 64.0f) + (para->detune - 64.0f) / 128.0f;
        chgPitch();
        gain = para->gain / 128.0f;

        float col = para->color / 128.0f;
        brpt = ftou32(col);
        nfres = 1.0f - sqrtf(col);
    }